

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer_container.cpp
# Opt level: O1

int32_t __thiscall cppnet::TimerContainer::LocalMinTime(TimerContainer *this)

{
  TIME_UNIT TVar1;
  int32_t iVar2;
  uint32_t uVar3;
  int iVar4;
  
  iVar2 = Bitmap::GetMinAfter(&this->_bitmap,this->_cur_time);
  if (iVar2 < 0) {
    if (this->_cur_time == 0) {
      return -1;
    }
    iVar2 = Bitmap::GetMinAfter(&this->_bitmap,0);
    if (iVar2 < 0) {
      return -1;
    }
    iVar4 = (this->_size + iVar2) - this->_cur_time;
  }
  else {
    iVar4 = iVar2 - this->_cur_time;
  }
  TVar1 = this->_time_unit;
  uVar3 = GetIndexLeftInterval(this,(uint16_t)iVar2);
  return uVar3 + iVar4 * TVar1;
}

Assistant:

int32_t TimerContainer::LocalMinTime() {
    int32_t next_time = _bitmap.GetMinAfter(_cur_time);
    if (next_time >= 0) {
        return (next_time - _cur_time) * _time_unit + GetIndexLeftInterval(next_time);
    }

    if (_cur_time > 0) {
        next_time = _bitmap.GetMinAfter(0);
        
        if (next_time >= 0) {
            return (next_time + _size - _cur_time) * _time_unit + GetIndexLeftInterval(next_time);
        }
    }
    return NO_TIMER;
}